

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

bool __thiscall
r_comp::Compiler::expression_tail
          (Compiler *this,Ptr *node,Class *p,uint16_t write_index,uint16_t *extent_index,bool write)

{
  pointer psVar1;
  pointer psVar2;
  byte bVar3;
  bool bVar4;
  Atom *this_00;
  const_reference __buf;
  ssize_t sVar5;
  long lVar6;
  uint16_t uVar7;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *p_Var8;
  ulong __n;
  bool local_aa;
  allocator local_a1;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *local_a0;
  ulong local_98;
  vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_> *local_90;
  uint16_t *local_88;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_80;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_70;
  string local_60;
  __shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  local_a0 = &node->super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>;
  local_88 = extent_index;
  if (this->in_hlp == true) {
    bVar3 = r_code::Atom::getAtomCount();
    local_98 = (ulong)(bVar3 - 1 & 0xffff);
    local_aa = true;
  }
  else {
    local_aa = Class::is_pattern(p,this->_metadata);
    local_98 = 0;
  }
  if ((write) && ((this->state).pattern_lvl != 0)) {
    uVar7 = write_index;
    while( true ) {
      bVar3 = r_code::Atom::getAtomCount();
      if ((uint)bVar3 + (uint)write_index <= (uint)uVar7) break;
      r_code::Atom::Wildcard((ushort)&local_60);
      this_00 = r_code::vector<r_code::Atom>::operator[]
                          ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)uVar7);
      r_code::Atom::operator=(this_00,(Atom *)&local_60);
      r_code::Atom::~Atom((Atom *)&local_60);
      uVar7 = uVar7 + 1;
    }
  }
  p_Var8 = local_a0;
  psVar1 = (local_a0->_M_ptr->args).
           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (local_a0->_M_ptr->args).
           super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar3 = r_code::Atom::getAtomCount();
  if (((long)psVar1 - (long)psVar2 >> 4 == (ulong)bVar3) ||
     (bVar4 = std::operator!=(&((p_Var8->_M_ptr->args).
                                super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish[-1].
                                super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr)->cmd,"::"), !bVar4)) {
    local_90 = &p->things_to_read;
    lVar6 = 0;
    __n = 0;
    while( true ) {
      psVar1 = (p_Var8->_M_ptr->args).
               super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(p_Var8->_M_ptr->args).
                        super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= __n) {
        return true;
      }
      if (__n == 0 && local_aa == true) {
        (this->state).pattern_lvl = (this->state).pattern_lvl + 1;
      }
      std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_40,
                 (__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar1->
                         super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 + lVar6));
      __buf = std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::at
                        (local_90,__n);
      sVar5 = read(this,(int)&local_40,__buf,1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      if ((char)sVar5 == '\0') break;
      if ((local_98 == __n & local_aa) == 1) {
        (this->state).pattern_lvl = (this->state).pattern_lvl - 1;
      }
      __n = __n + 1;
      lVar6 = lVar6 + 0x10;
      p_Var8 = local_a0;
    }
    std::__cxx11::string::string
              ((string *)&local_60," error: parsing element in expression",&local_a1);
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_70,local_a0);
    set_error(this,&local_60,(Ptr *)&local_70);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70._M_refcount);
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    std::__shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_80,p_Var8);
    bVar3 = r_code::Atom::getAtomCount();
    set_arity_error(this,(Ptr *)&local_80,(ushort)bVar3,
                    (uint16_t)
                    ((uint)(*(int *)&(p_Var8->_M_ptr->args).
                                     super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                           *(int *)&(p_Var8->_M_ptr->args).
                                    super__Vector_base<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 4));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80._M_refcount);
  }
  return false;
}

Assistant:

bool Compiler::expression_tail(RepliStruct::Ptr node, const Class &p, uint16_t write_index, uint16_t &extent_index, bool write)  // arity>0.
{
    bool entered_pattern;
    uint16_t pattern_end_index;

    if (in_hlp) {
        entered_pattern = true; //p.is_fact(_metadata);
        pattern_end_index = p.atom.getAtomCount() - 1;
    } else {
        entered_pattern = p.is_pattern(_metadata);
        pattern_end_index = 0;
    }

    if (write && state.pattern_lvl) { // fill up with wildcards that will be overwritten up to ::.
        for (uint16_t j = write_index; j < write_index + p.atom.getAtomCount(); ++j) {
            current_object->code[j] = Atom::Wildcard();
        }
    }

    if (node->args.size() != p.atom.getAtomCount() &&
        node->args[node->args.size() - 1]->cmd != "::") {
        set_arity_error(node, p.atom.getAtomCount(), node->args.size());
        return false;
    }

    for (size_t i = 0; i < node->args.size(); i++) {
        if (entered_pattern && i == 0) { // pattern begin.
            ++state.pattern_lvl;
        }

        if (!read(node->args[i], p.things_to_read.at(i), true, write_index + i, extent_index, write)) {
            set_error(" error: parsing element in expression", node);
            return false;
        }

        if (entered_pattern && i == pattern_end_index) { // pattern end.
            --state.pattern_lvl;
        }
    }

    return true;
}